

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O0

int av1_get_frame_buffer(void *cb_priv,size_t min_size,aom_codec_frame_buffer_t *fb)

{
  void *pvVar1;
  undefined8 *in_RDX;
  ulong in_RSI;
  int *in_RDI;
  InternalFrameBufferList *int_fb_list;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  int local_4;
  
  if (in_RDI == (int *)0x0) {
    local_4 = -1;
  }
  else {
    iVar2 = 0;
    while ((iVar2 < *in_RDI && (*(int *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 0x10) != 0)))
    {
      iVar2 = iVar2 + 1;
    }
    if (iVar2 == *in_RDI) {
      local_4 = -1;
    }
    else {
      if (*(ulong *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 8) < in_RSI) {
        aom_free(in_RDI);
        pvVar1 = aom_calloc(CONCAT44(iVar2,in_stack_ffffffffffffffd8),(size_t)in_RDI);
        *(void **)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18) = pvVar1;
        if (*(long *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18) == 0) {
          *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 8) = 0;
          return -1;
        }
        *(ulong *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 8) = in_RSI;
      }
      *in_RDX = *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18);
      in_RDX[1] = *(undefined8 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 8);
      *(undefined4 *)(*(long *)(in_RDI + 2) + (long)iVar2 * 0x18 + 0x10) = 1;
      in_RDX[2] = *(long *)(in_RDI + 2) + (long)iVar2 * 0x18;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int av1_get_frame_buffer(void *cb_priv, size_t min_size,
                         aom_codec_frame_buffer_t *fb) {
  int i;
  InternalFrameBufferList *const int_fb_list =
      (InternalFrameBufferList *)cb_priv;
  if (int_fb_list == NULL) return -1;

  // Find a free frame buffer.
  for (i = 0; i < int_fb_list->num_internal_frame_buffers; ++i) {
    if (!int_fb_list->int_fb[i].in_use) break;
  }

  if (i == int_fb_list->num_internal_frame_buffers) return -1;

  if (int_fb_list->int_fb[i].size < min_size) {
    aom_free(int_fb_list->int_fb[i].data);
    // The data must be zeroed to fix a valgrind error from the C loop filter
    // due to access uninitialized memory in frame border. It could be
    // skipped if border were totally removed.
    int_fb_list->int_fb[i].data = (uint8_t *)aom_calloc(1, min_size);
    if (!int_fb_list->int_fb[i].data) {
      int_fb_list->int_fb[i].size = 0;
      return -1;
    }
    int_fb_list->int_fb[i].size = min_size;
  }

  fb->data = int_fb_list->int_fb[i].data;
  fb->size = int_fb_list->int_fb[i].size;
  int_fb_list->int_fb[i].in_use = 1;

  // Set the frame buffer's private data to point at the internal frame buffer.
  fb->priv = &int_fb_list->int_fb[i];
  return 0;
}